

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::Conv1DWide::forward_impl
          (Conv1DWide *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  Index IVar4;
  Scalar *pSVar5;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  uint k;
  float xij;
  uint j;
  uint i;
  uint fcols;
  uint xcols;
  uint rows;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> f;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  undefined4 local_94;
  undefined4 in_stack_ffffffffffffff70;
  Scalar SVar6;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar7;
  undefined4 local_88;
  Index in_stack_ffffffffffffff88;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_ffffffffffffff90;
  Tensor *in_stack_ffffffffffffff98;
  
  TensorTools::Zero((Tensor *)0x4f718c);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::operator*(in_stack_ffffffffffffff98);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
  Tensor::operator*(in_stack_ffffffffffffff98);
  Tensor::operator*(in_stack_ffffffffffffff98);
  IVar4 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar2 = (uint)IVar4;
  IVar4 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x4f71f3);
  uVar3 = (uint)IVar4;
  IVar4 = Eigen::
          MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)0x4f7201);
  for (local_88 = 0; local_88 < uVar2; local_88 = local_88 + 1) {
    for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      pSVar5 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            CONCAT44(uVar2,uVar3));
      SVar6 = *pSVar5;
      for (local_94 = 0; local_94 < (uint)IVar4; local_94 = local_94 + 1) {
        pSVar5 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              CONCAT44(uVar2,uVar3));
        fVar1 = *pSVar5 * SVar6;
        pSVar5 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              CONCAT44(uVar2,uVar3));
        *pSVar5 = fVar1 + *pSVar5;
      }
    }
  }
  return;
}

Assistant:

void Conv1DWide::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DWide::forward not implemented for CUDA");
#else
  TensorTools::Zero(fx);
  auto x = **xs[0];  // input
  auto f = **xs[1];  // filter
  auto y = *fx;
  const unsigned rows = x.rows();
  const unsigned xcols = x.cols();
  const unsigned fcols = f.cols();
  for (unsigned i = 0; i < rows; ++i) {
    for (unsigned j = 0; j < xcols; ++j) {
      const float xij = x(i, j);
      for (unsigned k = 0; k < fcols; ++k)
        y(i, j + k) += f(i, k) * xij;
    }
  }
#endif
}